

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

CURLcode cr_mime_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                     _Bool *peos)

{
  bufq *pbVar1;
  int *piVar2;
  void *pvVar3;
  curl_trc_feat *pcVar4;
  curl_mimepart *pcVar5;
  bool bVar6;
  _Bool _Var7;
  ulong uVar8;
  size_t len;
  ssize_t sVar9;
  size_t sVar10;
  long lVar11;
  curl_mimepart *part_1;
  char *fmt;
  curl_mimepart *part;
  size_t *psVar12;
  _Bool hasread;
  void *local_160;
  size_t *local_158;
  Curl_easy *local_150;
  _Bool *local_148;
  bufq *local_140;
  char tmp [256];
  
  pvVar3 = reader->ctx;
  if ((*(byte *)((long)pvVar3 + 0x80) & 2) != 0) {
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
       && (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read(data,"cr_mime_read(len=%zu) is errored -> %d, eos=0",blen,
                    (ulong)*(uint *)((long)pvVar3 + 0x38));
    }
    *pnread = 0;
    *peos = false;
    return *(CURLcode *)((long)pvVar3 + 0x38);
  }
  if ((*(byte *)((long)pvVar3 + 0x80) & 1) != 0) {
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)) &&
        (0 < Curl_trc_feat_read.log_level)))) {
      Curl_trc_read(data,"cr_mime_read(len=%zu) seen eos -> 0, eos=1",blen);
    }
    *pnread = 0;
    *peos = true;
    return CURLE_OK;
  }
  lVar11 = *(long *)((long)pvVar3 + 0x28);
  if (-1 < lVar11) {
    uVar8 = lVar11 - *(long *)((long)pvVar3 + 0x30);
    if (uVar8 == 0 || lVar11 < *(long *)((long)pvVar3 + 0x30)) {
      blen = 0;
    }
    else if ((long)uVar8 < (long)blen) {
      blen = uVar8;
    }
  }
  pbVar1 = (bufq *)((long)pvVar3 + 0x40);
  local_158 = pnread;
  _Var7 = Curl_bufq_is_empty(pbVar1);
  psVar12 = local_158;
  local_160 = pvVar3;
  if (_Var7) {
    local_150 = data;
    local_148 = peos;
    local_140 = pbVar1;
    if (blen < 5) {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))
          ) && (0 < Curl_trc_feat_read.log_level)) {
        Curl_trc_read(data,"cr_mime_read(len=%zu), small read, using tmp",blen);
      }
      pcVar5 = *(curl_mimepart **)((long)pvVar3 + 0x20);
      do {
        _hasread = _hasread & 0xffffff00;
        len = readback_part(pcVar5,tmp,0x100,&hasread);
        pbVar1 = local_140;
      } while (len == 0xfffffffffffffffe);
      peos = local_148;
      data = local_150;
      psVar12 = local_158;
      if (len < 0x101) {
        _hasread = 0;
        sVar9 = Curl_bufq_write(local_140,(uchar *)tmp,len,(CURLcode *)&hasread);
        peos = local_148;
        data = local_150;
        if ((sVar9 < 0) ||
           (sVar10 = Curl_bufq_read(pbVar1,(uchar *)buf,blen,(CURLcode *)&hasread), (long)sVar10 < 0
           )) {
          *(byte *)((long)local_160 + 0x80) = *(byte *)((long)local_160 + 0x80) | 2;
          buf = (char *)(ulong)_hasread;
          *(uint *)((long)local_160 + 0x38) = _hasread;
          bVar6 = false;
        }
        else {
          bVar6 = true;
          len = sVar10;
        }
        psVar12 = local_158;
        if (!bVar6) {
          return (CURLcode)buf;
        }
      }
    }
    else {
      pcVar5 = *(curl_mimepart **)((long)pvVar3 + 0x20);
      do {
        tmp._0_4_ = tmp._0_4_ & 0xffffff00;
        len = readback_part(pcVar5,buf,blen,(_Bool *)tmp);
        peos = local_148;
        data = local_150;
      } while (len == 0xfffffffffffffffe);
    }
  }
  else {
    tmp[0] = '\0';
    tmp[1] = '\0';
    tmp[2] = '\0';
    tmp[3] = '\0';
    len = Curl_bufq_read(pbVar1,(uchar *)buf,blen,(CURLcode *)tmp);
    if ((long)len < 0) {
      *(byte *)((long)local_160 + 0x80) = *(byte *)((long)local_160 + 0x80) | 2;
      buf = (char *)(ulong)(uint)tmp._0_4_;
      *(undefined4 *)((long)local_160 + 0x38) = tmp._0_4_;
    }
    psVar12 = local_158;
    if ((long)len < 0) {
      return (CURLcode)buf;
    }
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))) &&
     (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read(data,"cr_mime_read(len=%zu), mime_read() -> %zd",blen,len);
  }
  if ((long)len < 0x10000000) {
    if (len + 2 < 2) {
      fmt = "read error getting mime data";
      goto LAB_001449ed;
    }
    if (len == 0) {
      if ((-1 < *(long *)((long)local_160 + 0x28)) &&
         (*(long *)((long)local_160 + 0x30) < *(long *)((long)local_160 + 0x28))) {
        Curl_failf(data,"client mime read EOF fail, only %ld/%ld of needed bytes read");
        return CURLE_READ_ERROR;
      }
      *psVar12 = 0;
      *peos = true;
      *(byte *)((long)local_160 + 0x80) = *(byte *)((long)local_160 + 0x80) | 1;
      goto LAB_00144b83;
    }
  }
  else {
    if (len == 0x10000000) {
      Curl_failf(data,"operation aborted by callback");
      *psVar12 = 0;
      *peos = false;
      *(byte *)((long)local_160 + 0x80) = *(byte *)((long)local_160 + 0x80) | 2;
      *(undefined4 *)((long)local_160 + 0x38) = 0x2a;
      return CURLE_ABORTED_BY_CALLBACK;
    }
    if (len == 0x10000001) {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))
          ) && (0 < Curl_trc_feat_read.log_level)) {
        Curl_trc_read(data,"cr_mime_read(len=%zu), paused by callback",blen);
      }
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 | 0x20;
      *psVar12 = 0;
      *peos = false;
      goto LAB_00144b83;
    }
  }
  if (len <= blen) {
    lVar11 = *(long *)((long)local_160 + 0x30) + len;
    *(long *)((long)local_160 + 0x30) = lVar11;
    if (-1 < *(long *)((long)local_160 + 0x28)) {
      *(byte *)((long)local_160 + 0x80) =
           *(byte *)((long)local_160 + 0x80) & 0xfe | *(long *)((long)local_160 + 0x28) <= lVar11;
    }
    *psVar12 = len;
    *peos = (_Bool)(*(byte *)((long)local_160 + 0x80) & 1);
LAB_00144b83:
    if (data == (Curl_easy *)0x0) {
      return CURLE_OK;
    }
    if (((data->set).field_0x89f & 0x40) != 0) {
      pcVar4 = (data->state).feat;
      if ((pcVar4 != (curl_trc_feat *)0x0) && (pcVar4->log_level < 1)) {
        return CURLE_OK;
      }
      if (0 < Curl_trc_feat_read.log_level) {
        Curl_trc_read(data,"cr_mime_read(len=%zu, total=%ld, read=%ld) -> %d, %zu, %d",blen,
                      *(undefined8 *)((long)local_160 + 0x28),
                      *(undefined8 *)((long)local_160 + 0x30),0,*psVar12,(ulong)*peos);
        return CURLE_OK;
      }
      return CURLE_OK;
    }
    return CURLE_OK;
  }
  fmt = "read function returned funny value";
LAB_001449ed:
  Curl_failf(data,fmt);
  *psVar12 = 0;
  *peos = false;
  *(byte *)((long)local_160 + 0x80) = *(byte *)((long)local_160 + 0x80) | 2;
  *(undefined4 *)((long)local_160 + 0x38) = 0x1a;
  return CURLE_READ_ERROR;
}

Assistant:

static CURLcode cr_mime_read(struct Curl_easy *data,
                             struct Curl_creader *reader,
                             char *buf, size_t blen,
                             size_t *pnread, bool *peos)
{
  struct cr_mime_ctx *ctx = reader->ctx;
  size_t nread;
  char tmp[256];


  /* Once we have errored, we will return the same error forever */
  if(ctx->errored) {
    CURL_TRC_READ(data, "cr_mime_read(len=%zu) is errored -> %d, eos=0",
                  blen, ctx->error_result);
    *pnread = 0;
    *peos = FALSE;
    return ctx->error_result;
  }
  if(ctx->seen_eos) {
    CURL_TRC_READ(data, "cr_mime_read(len=%zu) seen eos -> 0, eos=1", blen);
    *pnread = 0;
    *peos = TRUE;
    return CURLE_OK;
  }
  /* respect length limitations */
  if(ctx->total_len >= 0) {
    curl_off_t remain = ctx->total_len - ctx->read_len;
    if(remain <= 0)
      blen = 0;
    else if(remain < (curl_off_t)blen)
      blen = (size_t)remain;
  }

  if(!Curl_bufq_is_empty(&ctx->tmpbuf)) {
    CURLcode result = CURLE_OK;
    ssize_t n = Curl_bufq_read(&ctx->tmpbuf, (unsigned char *)buf, blen,
                               &result);
    if(n < 0) {
      ctx->errored = TRUE;
      ctx->error_result = result;
      return result;
    }
    nread = (size_t)n;
  }
  else if(blen <= 4) {
    /* Curl_mime_read() may go into an infinite loop when reading
     * via a base64 encoder, as it stalls when the read buffer is too small
     * to contain a complete 3 byte encoding. Read into a larger buffer
     * and use that until empty. */
    CURL_TRC_READ(data, "cr_mime_read(len=%zu), small read, using tmp", blen);
    nread = Curl_mime_read(tmp, 1, sizeof(tmp), ctx->part);
    if(nread <= sizeof(tmp)) {
      CURLcode result = CURLE_OK;
      ssize_t n = Curl_bufq_write(&ctx->tmpbuf, (unsigned char *)tmp, nread,
                                  &result);
      if(n < 0) {
        ctx->errored = TRUE;
        ctx->error_result = result;
        return result;
      }
      /* stored it, read again */
      n = Curl_bufq_read(&ctx->tmpbuf, (unsigned char *)buf, blen, &result);
      if(n < 0) {
        ctx->errored = TRUE;
        ctx->error_result = result;
        return result;
      }
      nread = (size_t)n;
    }
  }
  else
    nread = Curl_mime_read(buf, 1, blen, ctx->part);

  CURL_TRC_READ(data, "cr_mime_read(len=%zu), mime_read() -> %zd",
                blen, nread);

  switch(nread) {
  case 0:
    if((ctx->total_len >= 0) && (ctx->read_len < ctx->total_len)) {
      failf(data, "client mime read EOF fail, "
            "only %"FMT_OFF_T"/%"FMT_OFF_T
            " of needed bytes read", ctx->read_len, ctx->total_len);
      return CURLE_READ_ERROR;
    }
    *pnread = 0;
    *peos = TRUE;
    ctx->seen_eos = TRUE;
    break;

  case CURL_READFUNC_ABORT:
    failf(data, "operation aborted by callback");
    *pnread = 0;
    *peos = FALSE;
    ctx->errored = TRUE;
    ctx->error_result = CURLE_ABORTED_BY_CALLBACK;
    return CURLE_ABORTED_BY_CALLBACK;

  case CURL_READFUNC_PAUSE:
    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    CURL_TRC_READ(data, "cr_mime_read(len=%zu), paused by callback", blen);
    data->req.keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    *pnread = 0;
    *peos = FALSE;
    break; /* nothing was read */

  case STOP_FILLING:
  case READ_ERROR:
    failf(data, "read error getting mime data");
    *pnread = 0;
    *peos = FALSE;
    ctx->errored = TRUE;
    ctx->error_result = CURLE_READ_ERROR;
    return CURLE_READ_ERROR;

  default:
    if(nread > blen) {
      /* the read function returned a too large value */
      failf(data, "read function returned funny value");
      *pnread = 0;
      *peos = FALSE;
      ctx->errored = TRUE;
      ctx->error_result = CURLE_READ_ERROR;
      return CURLE_READ_ERROR;
    }
    ctx->read_len += nread;
    if(ctx->total_len >= 0)
      ctx->seen_eos = (ctx->read_len >= ctx->total_len);
    *pnread = nread;
    *peos = ctx->seen_eos;
    break;
  }

  CURL_TRC_READ(data, "cr_mime_read(len=%zu, total=%" FMT_OFF_T
                ", read=%"FMT_OFF_T") -> %d, %zu, %d",
                blen, ctx->total_len, ctx->read_len, CURLE_OK, *pnread, *peos);
  return CURLE_OK;
}